

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack29_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *in;
  *out = uVar1 & 0x1fffffff;
  out[1] = uVar1 >> 0x1d;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1d | (uVar2 & 0x3ffffff) << 3;
  out[2] = uVar2 >> 0x1a;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x1a | (uVar1 & 0x7fffff) << 6;
  uVar2 = in[3];
  out[3] = uVar1 >> 0x17;
  out[3] = uVar1 >> 0x17 | (uVar2 & 0xfffff) << 9;
  out[4] = uVar2 >> 0x14;
  uVar1 = in[4];
  out[4] = uVar2 >> 0x14 | (uVar1 & 0x1ffff) << 0xc;
  out[5] = uVar1 >> 0x11;
  uVar2 = in[5];
  out[5] = uVar1 >> 0x11 | (uVar2 & 0x3fff) << 0xf;
  uVar1 = in[6];
  out[6] = uVar2 >> 0xe;
  out[6] = uVar2 >> 0xe | (uVar1 & 0x7ff) << 0x12;
  out[7] = uVar1 >> 0xb;
  uVar2 = in[7];
  out[7] = uVar1 >> 0xb | (uVar2 & 0xff) << 0x15;
  out[8] = uVar2 >> 8;
  uVar1 = in[8];
  out[8] = uVar2 >> 8 | (uVar1 & 0x1f) << 0x18;
  uVar2 = in[9];
  out[9] = uVar1 >> 5;
  out[9] = uVar1 >> 5 | (uVar2 & 3) << 0x1b;
  uVar1 = in[10];
  out[10] = uVar2 >> 2 & 0x1fffffff;
  out[0xb] = uVar2 >> 0x1f;
  out[0xb] = uVar2 >> 0x1f | (uVar1 & 0xfffffff) << 1;
  uVar2 = in[0xb];
  out[0xc] = uVar1 >> 0x1c;
  out[0xc] = uVar1 >> 0x1c | (uVar2 & 0x1ffffff) << 4;
  out[0xd] = uVar2 >> 0x19;
  uVar1 = in[0xc];
  uVar3 = in[0xd];
  out[0xd] = uVar2 >> 0x19 | (uVar1 & 0x3fffff) << 7;
  out[0xe] = uVar1 >> 0x16;
  out[0xe] = uVar1 >> 0x16 | (uVar3 & 0x7ffff) << 10;
  uVar1 = in[0xe];
  out[0xf] = uVar3 >> 0x13;
  out[0xf] = uVar3 >> 0x13 | (uVar1 & 0xffff) << 0xd;
  out[0x10] = uVar1 >> 0x10;
  uVar2 = in[0xf];
  uVar3 = in[0x10];
  out[0x10] = uVar1 >> 0x10 | (uVar2 & 0x1fff) << 0x10;
  out[0x11] = uVar2 >> 0xd;
  out[0x11] = uVar2 >> 0xd | (uVar3 & 0x3ff) << 0x13;
  uVar1 = in[0x11];
  out[0x12] = uVar3 >> 10;
  out[0x12] = uVar3 >> 10 | (uVar1 & 0x7f) << 0x16;
  out[0x13] = uVar1 >> 7;
  uVar2 = in[0x12];
  uVar3 = in[0x13];
  out[0x13] = uVar1 >> 7 | (uVar2 & 0xf) << 0x19;
  out[0x14] = uVar2 >> 4;
  out[0x14] = uVar2 >> 4 | (uVar3 & 1) << 0x1c;
  out[0x15] = uVar3 >> 1 & 0x1fffffff;
  out[0x16] = uVar3 >> 0x1e;
  uVar1 = in[0x14];
  out[0x16] = uVar3 >> 0x1e | (uVar1 & 0x7ffffff) << 2;
  uVar2 = in[0x15];
  out[0x17] = uVar1 >> 0x1b;
  out[0x17] = uVar1 >> 0x1b | (uVar2 & 0xffffff) << 5;
  out[0x18] = uVar2 >> 0x18;
  uVar1 = in[0x16];
  out[0x18] = uVar2 >> 0x18 | (uVar1 & 0x1fffff) << 8;
  out[0x19] = uVar1 >> 0x15;
  uVar2 = in[0x17];
  out[0x19] = uVar1 >> 0x15 | (uVar2 & 0x3ffff) << 0xb;
  uVar1 = in[0x18];
  out[0x1a] = uVar2 >> 0x12;
  out[0x1a] = uVar2 >> 0x12 | (uVar1 & 0x7fff) << 0xe;
  out[0x1b] = uVar1 >> 0xf;
  uVar2 = in[0x19];
  out[0x1b] = uVar1 >> 0xf | (uVar2 & 0xfff) << 0x11;
  out[0x1c] = uVar2 >> 0xc;
  uVar1 = in[0x1a];
  out[0x1c] = uVar2 >> 0xc | (uVar1 & 0x1ff) << 0x14;
  uVar2 = in[0x1b];
  out[0x1d] = uVar1 >> 9;
  out[0x1d] = uVar1 >> 9 | (uVar2 & 0x3f) << 0x17;
  out[0x1e] = uVar2 >> 6;
  uVar1 = in[0x1c];
  out[0x1e] = uVar2 >> 6 | (uVar1 & 7) << 0x1a;
  out[0x1f] = uVar1 >> 3;
  return in + 0x1d;
}

Assistant:

const uint32_t *__fastunpack29_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 5)) << (29 - 5);
  out++;
  *out = ((*in) >> 5);
  ++in;
  *out |= ((*in) % (1U << 2)) << (29 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 29);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 28)) << (29 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 25)) << (29 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 22)) << (29 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 19)) << (29 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 16)) << (29 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 13)) << (29 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 10)) << (29 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 7)) << (29 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 4)) << (29 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 1)) << (29 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 29);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 27)) << (29 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 24)) << (29 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 21)) << (29 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 18)) << (29 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 15)) << (29 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 12)) << (29 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 9)) << (29 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 6)) << (29 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 3)) << (29 - 3);
  out++;
  *out = ((*in) >> 3);
  ++in;
  out++;

  return in;
}